

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CoverCrossSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CoverCrossSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::CoverpointSymbol_const*,18446744073709551615ul>>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          span<const_slang::ast::CoverpointSymbol_*,_18446744073709551615UL> *args_3)

{
  CoverCrossSymbol *pCVar1;
  span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *in_RSI;
  Compilation *in_stack_00000180;
  CoverCrossSymbol *in_stack_00000188;
  SourceLocation in_stack_00000190;
  undefined1 in_stack_00000198 [16];
  undefined1 in_stack_000001b0 [16];
  span<const_slang::ast::CoverpointSymbol_*,_18446744073709551615UL> *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pCVar1 = (CoverCrossSymbol *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                    (size_t)in_stack_ffffffffffffff98);
  std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::CoverpointSymbol_*,_18446744073709551615UL>
            (in_RSI,in_stack_ffffffffffffff98);
  ast::CoverCrossSymbol::CoverCrossSymbol
            (in_stack_00000188,in_stack_00000180,(string_view)in_stack_00000198,in_stack_00000190,
             (span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>)
             in_stack_000001b0);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }